

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
RtApi::getDeviceIds(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
                   RtApi *this)

{
  size_type sVar1;
  reference __x;
  uint local_20;
  uint m;
  RtApi *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *deviceIds;
  
  (*this->_vptr_RtApi[0xb])();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  for (local_20 = 0;
      sVar1 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::size
                        (&this->deviceList_), local_20 < sVar1; local_20 = local_20 + 1) {
    __x = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::operator[]
                    (&this->deviceList_,(ulong)local_20);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,&__x->ID);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> RtApi :: getDeviceIds( void )
{
  probeDevices();

  // Copy device IDs into output vector.
  std::vector<unsigned int> deviceIds;
  for ( unsigned int m=0; m<deviceList_.size(); m++ )
    deviceIds.push_back( deviceList_[m].ID );

  return deviceIds;
}